

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::Qrt(BN *__return_storage_ptr__,BN *this)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  pointer puVar7;
  pointer puVar8;
  ulong uVar9;
  long lVar10;
  
  uVar6 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < 0x20001fff2) {
    fastQrt(__return_storage_ptr__,this);
  }
  else {
    BN(__return_storage_ptr__,uVar6 | 1,0);
    puVar3 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->ba).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
    if (lVar4 != 0) {
      uVar5 = lVar4 >> 1;
      puVar7 = puVar2;
      puVar8 = puVar3;
      uVar6 = 0;
      do {
        uVar9 = (ulong)puVar3[uVar6] * (ulong)puVar3[uVar6] + (ulong)puVar2[uVar6 * 2];
        puVar2[uVar6 * 2] = (unsigned_short)uVar9;
        uVar1 = uVar6 + 1;
        if (uVar1 < uVar5) {
          lVar4 = 1;
          do {
            uVar9 = (uVar9 >> 0x10) + (ulong)puVar7[lVar4] +
                    (ulong)((uint)puVar3[uVar6] * 2) * (ulong)puVar8[lVar4];
            puVar7[lVar4] = (unsigned_short)uVar9;
            lVar10 = uVar6 + lVar4;
            lVar4 = lVar4 + 1;
          } while (lVar10 + 1U < uVar5);
        }
        lVar4 = uVar6 + uVar5;
        lVar10 = (uVar9 >> 0x10) + (ulong)puVar2[lVar4];
        puVar2[lVar4] = (unsigned_short)lVar10;
        puVar2[lVar4 + 1] = puVar2[lVar4 + 1] + (short)((ulong)lVar10 >> 0x10);
        puVar8 = puVar8 + 1;
        puVar7 = puVar7 + 2;
        uVar6 = uVar1;
      } while (uVar1 != uVar5 + (uVar5 == 0));
    }
    puVar3 = (__return_storage_ptr__->ba).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = (long)puVar3 - (long)puVar2;
    while ((2 < uVar6 && (puVar3 = puVar3 + -1, *puVar3 == 0))) {
      (__return_storage_ptr__->ba).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
      uVar6 = uVar6 - 2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::Qrt() const
{
    if (ba.size() < MaximalSizeForFastMul)
        return fastQrt();

    BN res(2 * ba.size() + 1, 0);
    for (size_t i = 0; i < ba.size(); ++i) {
        bt4 cuv = res.ba[2 * i] + static_cast<bt2>(ba[i]) * ba[i];
        res.ba[2 * i] = cuv;
        for (size_t j = i + 1; j < ba.size(); ++j) {
            cuv = static_cast<bt4>(res.ba[i + j]) +
                ((static_cast<bt4>(ba[i]) * ba[j]) << 1) +
                (cuv >> bz8);
            res.ba[i + j] = cuv;
        }
        cuv = res.ba[i + ba.size()] + (cuv >> bz8);
        res.ba[i + ba.size()] = cuv;
        res.ba[i + ba.size() + 1] += (cuv >> bz8);
    }
    Norm(res.ba);
    return res;
}